

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O3

uint32_t recall_tree_ns::oas_predict(recall_tree *b,single_learner *base,uint32_t cn,example *ec)

{
  uchar **ppuVar1;
  uint64_t *puVar2;
  float fVar3;
  label_t lVar4;
  node *pnVar5;
  int iVar6;
  node_pred *pnVar7;
  uint32_t local_44;
  float local_40;
  
  lVar4 = (ec->l).multi;
  fVar3 = (ec->pred).scalar;
  add_node_id_feature(b,cn,ec);
  (ec->l).cs.costs._begin = (wclass *)0x7f7fffff;
  (ec->l).simple.initial = 0.0;
  pnVar5 = (b->nodes)._begin;
  pnVar7 = pnVar5[cn].preds._begin;
  if (pnVar7 == pnVar5[cn].preds._end) {
    local_44 = 0;
  }
  else {
    pnVar5 = pnVar5 + cn;
    local_44 = 0;
    local_40 = -3.4028235e+38;
    do {
      if ((pnVar5->preds)._begin + b->max_candidates <= pnVar7) break;
      iVar6 = (int)b->max_routers + pnVar7->label + -1;
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 + (ulong)(uint)(*(int *)(base + 0xe0) * iVar6);
      (**(code **)(base + 0x30))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),ec);
      puVar2 = &(ec->super_example_predict).ft_offset;
      *puVar2 = *puVar2 - (ulong)(uint)(iVar6 * *(int *)(base + 0xe0));
      if ((local_44 == 0) || (local_40 < ec->partial_prediction)) {
        local_44 = pnVar7->label;
        local_40 = ec->partial_prediction;
      }
      pnVar7 = pnVar7 + 1;
      pnVar5 = (b->nodes)._begin + cn;
    } while (pnVar7 != (pnVar5->preds)._end);
  }
  features::clear((ec->super_example_predict).feature_space + 0x88);
  ppuVar1 = &(ec->super_example_predict).indices._end;
  *ppuVar1 = *ppuVar1 + -1;
  (ec->l).multi = lVar4;
  (ec->pred).scalar = fVar3;
  return local_44;
}

Assistant:

uint32_t oas_predict(recall_tree& b, single_learner& base, uint32_t cn, example& ec)
{
  MULTICLASS::label_t mc = ec.l.multi;
  uint32_t save_pred = ec.pred.multiclass;

  uint32_t amaxscore = 0;

  add_node_id_feature(b, cn, ec);
  ec.l.simple = {FLT_MAX, 0.f, 0.f};

  float maxscore = std::numeric_limits<float>::lowest();
  for (node_pred* ls = b.nodes[cn].preds.begin();
       ls != b.nodes[cn].preds.end() && ls < b.nodes[cn].preds.begin() + b.max_candidates; ++ls)
  {
    base.predict(ec, b.max_routers + ls->label - 1);
    if (amaxscore == 0 || ec.partial_prediction > maxscore)
    {
      maxscore = ec.partial_prediction;
      amaxscore = ls->label;
    }
  }

  remove_node_id_feature(b, cn, ec);

  ec.l.multi = mc;
  ec.pred.multiclass = save_pred;

  return amaxscore;
}